

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text2cpp.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  OutputList *this;
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  char *pcVar4;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0 [8];
  string arg_1;
  ListType listvar_1;
  string arg_chk_1;
  OutputList str_list_1;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8 [8];
  string arg;
  ListType listvar;
  allocator<char> local_69;
  string local_68 [8];
  string arg_chk;
  undefined1 local_38 [8];
  OutputList str_list;
  char **argv_local;
  int argc_local;
  
  str_list._24_8_ = argv;
  if ((argc != 3) && (argc != 5)) {
    poVar2 = std::operator<<((ostream *)&std::cerr,*argv);
    poVar2 = std::operator<<(poVar2,
                             ": Requires 4 arguments file output varname type (c or s or b)\n Or requires two arguments and reads from stdin and prints to stdout\n$ "
                            );
    poVar2 = std::operator<<(poVar2,*(char **)str_list._24_8_);
    poVar2 = std::operator<<(poVar2," sourcefile outputfile variablename s\n$ cat sourcefile | ");
    poVar2 = std::operator<<(poVar2,*(char **)str_list._24_8_);
    poVar2 = std::operator<<(poVar2,
                             " varname s\nTo use greater than sorting add a g type variable:\n$ ");
    poVar2 = std::operator<<(poVar2,*(char **)str_list._24_8_);
    poVar2 = std::operator<<(poVar2," inputfile outputfile varname cg\n");
    poVar2 = std::operator<<(poVar2,"For less than add l to type variable like this:\n$ ");
    poVar2 = std::operator<<(poVar2,*(char **)str_list._24_8_);
    std::operator<<(poVar2," inputfile outputfile varname sl\n");
    exit(1);
  }
  if (argc == 5) {
    lst::OutputList::OutputList((OutputList *)local_38);
    lst::OutputList::setSkip((OutputList *)local_38,false);
    pcVar4 = *(char **)(str_list._24_8_ + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_68,pcVar4,&local_69);
    std::allocator<char>::~allocator(&local_69);
    uVar3 = std::__cxx11::string::length();
    if ((1 < uVar3) &&
       (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_68), *pcVar4 == 'p')) {
      lst::OutputList::setSkip((OutputList *)local_38,true);
    }
    pcVar4 = *(char **)(str_list._24_8_ + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&listvar,pcVar4,(allocator<char> *)(arg.field_2._M_local_buf + 0xf));
    bVar1 = lst::OutputList::addFile((OutputList *)local_38,(string *)&listvar);
    std::__cxx11::string::~string((string *)&listvar);
    std::allocator<char>::~allocator((allocator<char> *)(arg.field_2._M_local_buf + 0xf));
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Error could not load list from text file: ");
      poVar2 = std::operator<<(poVar2,*(char **)(str_list._24_8_ + 8));
      std::operator<<(poVar2,"\n");
      exit(1);
    }
    pcVar4 = *(char **)(str_list._24_8_ + 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_b8,pcVar4,&local_b9);
    std::allocator<char>::~allocator(&local_b9);
    if (**(char **)(str_list._24_8_ + 0x20) == 'c') {
      arg.field_2._8_4_ = 1;
    }
    else if (**(char **)(str_list._24_8_ + 0x20) == 'b') {
      arg.field_2._8_4_ = 2;
    }
    else if (**(char **)(str_list._24_8_ + 0x20) == 's') {
      arg.field_2._8_4_ = 0;
    }
    pcVar4 = *(char **)(str_list._24_8_ + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,pcVar4,&local_e1);
    bVar1 = lst::OutputList::validName((OutputList *)local_38,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    if (!bVar1) {
      std::operator<<((ostream *)&std::cerr,
                      "Invalid variable name, must start with a letter and only contain digits and alpha characters.\n"
                     );
      exit(1);
    }
    uVar3 = std::__cxx11::string::length();
    if ((uVar3 < 2) ||
       (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_b8), *pcVar4 != 'g')) {
      uVar3 = std::__cxx11::string::length();
      if ((uVar3 < 2) ||
         (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_b8), *pcVar4 != 'l')) {
        uVar3 = std::__cxx11::string::length();
        if ((1 < uVar3) &&
           (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_b8), *pcVar4 == 'p')) {
          lst::OutputList::setSkip((OutputList *)local_38,true);
        }
      }
      else {
        lst::OutputList::sort((OutputList *)local_38,false);
      }
    }
    else {
      lst::OutputList::sort((OutputList *)local_38,true);
    }
    pcVar4 = *(char **)(str_list._24_8_ + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,pcVar4,&local_109);
    pcVar4 = *(char **)(str_list._24_8_ + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,pcVar4,(allocator<char> *)&str_list_1.field_0x1f);
    bVar1 = lst::OutputList::outputToFile
                      ((OutputList *)local_38,&local_108,&local_130,arg.field_2._8_4_);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator((allocator<char> *)&str_list_1.field_0x1f);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Sucessfully output list to: ");
      poVar2 = std::operator<<(poVar2,*(char **)(str_list._24_8_ + 0x10));
      std::operator<<(poVar2,"\n");
      poVar2 = std::operator<<((ostream *)&std::cout,"Input: ");
      poVar2 = std::operator<<(poVar2,*(char **)(str_list._24_8_ + 8));
      std::operator<<(poVar2,"\n");
      poVar2 = std::operator<<((ostream *)&std::cout,"Output: ");
      poVar2 = std::operator<<(poVar2,*(char **)(str_list._24_8_ + 0x10));
      std::operator<<(poVar2,"\n");
      poVar2 = std::operator<<((ostream *)&std::cout,"Variables: ");
      poVar2 = std::operator<<(poVar2,*(char **)(str_list._24_8_ + 0x18));
      poVar2 = std::operator<<(poVar2,"_arr and ");
      poVar2 = std::operator<<(poVar2,*(char **)(str_list._24_8_ + 0x18));
      poVar2 = std::operator<<(poVar2,"_size");
      std::operator<<(poVar2,"\n");
      if (arg.field_2._8_4_ == 0) {
        std::operator<<((ostream *)&std::cout,"Varaible type: std::string\n");
      }
      else if (arg.field_2._8_4_ == 1) {
        std::operator<<((ostream *)&std::cout,"Variable type: const char *\n");
      }
      else if (arg.field_2._8_4_ == 2) {
        std::operator<<((ostream *)&std::cout,"Varaible type: char array[]\n");
      }
    }
    else {
      std::operator<<((ostream *)&std::cout,"Encountered an error..\n");
    }
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_68);
    lst::OutputList::~OutputList((OutputList *)local_38);
  }
  else if (argc == 3) {
    this = (OutputList *)((long)&arg_chk_1.field_2 + 8);
    lst::OutputList::OutputList(this);
    lst::OutputList::setSkip(this,false);
    pcVar4 = *(char **)(str_list._24_8_ + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&listvar_1,pcVar4,(allocator<char> *)(arg_1.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(arg_1.field_2._M_local_buf + 0xf));
    uVar3 = std::__cxx11::string::length();
    if ((1 < uVar3) &&
       (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&listvar_1), *pcVar4 == 'p')) {
      lst::OutputList::setSkip((OutputList *)((long)&arg_chk_1.field_2 + 8),true);
    }
    bVar1 = lst::OutputList::addStream
                      ((OutputList *)((long)&arg_chk_1.field_2 + 8),(istream *)&std::cin);
    if (bVar1) {
      pcVar4 = *(char **)(str_list._24_8_ + 0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1a0,pcVar4,&local_1a1);
      std::allocator<char>::~allocator(&local_1a1);
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_1a0);
      if (*pcVar4 == 'c') {
        arg_1.field_2._8_4_ = 1;
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_1a0);
        if (*pcVar4 == 's') {
          arg_1.field_2._8_4_ = 0;
        }
        else {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_1a0);
          if (*pcVar4 == 'b') {
            arg_1.field_2._8_4_ = 2;
          }
        }
      }
      uVar3 = std::__cxx11::string::length();
      if ((uVar3 < 2) ||
         (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_1a0), *pcVar4 != 'g')) {
        uVar3 = std::__cxx11::string::length();
        if ((1 < uVar3) &&
           (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_1a0), *pcVar4 == 'l')) {
          lst::OutputList::sort((OutputList *)((long)&arg_chk_1.field_2 + 8),false);
        }
      }
      else {
        lst::OutputList::sort((OutputList *)((long)&arg_chk_1.field_2 + 8),true);
      }
      pcVar4 = *(char **)(str_list._24_8_ + 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,pcVar4,&local_1c9);
      bVar1 = lst::OutputList::validName((OutputList *)((long)&arg_chk_1.field_2 + 8),&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::allocator<char>::~allocator(&local_1c9);
      if (!bVar1) {
        std::operator<<((ostream *)&std::cerr,
                        "Invalid variable name, must start with a letter and only contain digits and alpha characters.\n"
                       );
        exit(1);
      }
      pcVar4 = *(char **)(str_list._24_8_ + 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,pcVar4,&local_1f1);
      bVar1 = lst::OutputList::outputToFile
                        ((OutputList *)((long)&arg_chk_1.field_2 + 8),(ostream *)&std::cout,
                         &local_1f0,arg_1.field_2._8_4_);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator(&local_1f1);
      if (!bVar1) {
        std::operator<<((ostream *)&std::cout,"Failed to output stream...\n");
      }
      std::__cxx11::string::~string(local_1a0);
    }
    std::__cxx11::string::~string((string *)&listvar_1);
    lst::OutputList::~OutputList((OutputList *)((long)&arg_chk_1.field_2 + 8));
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    if(argc !=3 && argc != 5) {
        std::cerr << argv[0] << ": Requires 4 arguments file output varname type (c or s or b)\n Or requires two arguments and reads from stdin and prints to stdout\n$ " << argv[0] << " sourcefile outputfile variablename s\n$ cat sourcefile | " << argv[0] << " varname s\nTo use greater than sorting add a g type variable:\n$ " << argv[0] << " inputfile outputfile varname cg\n" << "For less than add l to type variable like this:\n$ " << argv[0] << " inputfile outputfile varname sl\n";
        exit(EXIT_FAILURE);
    }
    if(argc == 5) {
        lst::OutputList str_list;
        str_list.setSkip(false);
        std::string arg_chk = argv[2];
        if(arg_chk.length()>1 && arg_chk[1] == 'p')
            str_list.setSkip(true);
        if(str_list.addFile(argv[1])) {
            lst::ListType listvar;
            std::string arg = argv[4];
            if(argv[4][0] == 'c')
                listvar = lst::ListType::CHAR;
            else if(argv[4][0] == 'b')
                listvar = lst::ListType::BINARY;
            else if(argv[4][0] == 's')
                listvar = lst::ListType::STRING;
            
            if(str_list.validName(argv[3]) == false) {
                std::cerr << "Invalid variable name, must start with a letter and only contain digits and alpha characters.\n";
                exit(EXIT_FAILURE);
            }

            if(arg.length() > 1 && arg[1] == 'g')
                str_list.sort(true);
            else if(arg.length() > 1 && arg[1] == 'l')
                str_list.sort(false);
            else if(arg.length() > 1 && arg[1] == 'p')
                str_list.setSkip(true);
            
            if(str_list.outputToFile(argv[2],argv[3], listvar)) {
                std::cout << "Sucessfully output list to: " << argv[2] << "\n";
                std::cout << "Input: " << argv[1] << "\n";
                std::cout << "Output: " << argv[2] << "\n";
                std::cout << "Variables: " << argv[3] << "_arr and " << argv[3] << "_size"<< "\n";
                if(listvar == lst::ListType::STRING) {
                    std::cout << "Varaible type: std::string\n";
                } else if(listvar == lst::ListType::CHAR) {
                    std::cout << "Variable type: const char *\n";
                } else if(listvar == lst::ListType::BINARY) {
                    std::cout << "Varaible type: char array[]\n";
                }
            } else {
                std::cout << "Encountered an error..\n";
            }
        } else {
            std::cerr << "Error could not load list from text file: " << argv[1] << "\n";
            exit(EXIT_FAILURE);
        }
    } else if(argc == 3) {
        lst::OutputList str_list;
        str_list.setSkip(false);
        std::string arg_chk = argv[2];
        if(arg_chk.length()>1 && arg_chk[1] == 'p')
            str_list.setSkip(true);
        
        
        if(str_list.addStream(std::cin)) {
            lst::ListType listvar;
            
            std::string arg = argv[2];
            if(arg[0] == 'c')
                listvar = lst::ListType::CHAR;
            else if(arg[0] == 's')
                listvar = lst::ListType::STRING;
            else if(arg[0] == 'b')
                listvar = lst::ListType::BINARY;
            
            if(arg.length() > 1 && arg[1] == 'g')
                str_list.sort(true);
            else if(arg.length() > 1 && arg[1] == 'l')
                str_list.sort(false);
          
            
            
            if(str_list.validName(argv[1]) == false) {
                std::cerr << "Invalid variable name, must start with a letter and only contain digits and alpha characters.\n";
                exit(EXIT_FAILURE);
            }
            
            if(str_list.outputToFile(std::cout,argv[1], listvar) == false) {
                std::cout << "Failed to output stream...\n";
            }
        }
    }
    return 0;
}